

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateCloningCode
          (MessageGenerator *this,Printer *printer)

{
  mapped_type *pmVar1;
  OneofDescriptor *pOVar2;
  FieldGeneratorBase *pFVar3;
  Descriptor *pDVar4;
  AlphaNum *a;
  FieldDescriptor *descriptor;
  int i32;
  long lVar5;
  long lVar6;
  Printer *pPVar7;
  FieldDescriptor *descriptor_00;
  long lVar8;
  allocator local_d1;
  MessageGenerator *local_d0;
  Printer *local_c8;
  key_type local_c0;
  long local_a0;
  long local_98;
  AlphaNum local_90;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0 = this;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  class_name_abi_cxx11_((string *)&local_90,local_d0);
  std::__cxx11::string::string((string *)&local_c0,"class_name",&local_d1);
  local_c8 = printer;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_90);
  pPVar7 = local_c8;
  io::Printer::Print(local_c8,&vars,"public $class_name$($class_name$ other) : this() {\n");
  io::Printer::Indent(pPVar7);
  for (i32 = 0; i32 < local_d0->has_bit_field_count_; i32 = i32 + 1) {
    strings::AlphaNum::AlphaNum(&local_90,i32);
    StrCat_abi_cxx11_(&local_c0,(protobuf *)&local_90,a);
    io::Printer::Print<char[2],std::__cxx11::string>
              (pPVar7,"_hasBits$i$ = other._hasBits$i$;\n",(char (*) [2])"i",&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  lVar6 = 0;
  for (lVar5 = 0; pDVar4 = local_d0->descriptor_, lVar5 < *(int *)(pDVar4 + 4); lVar5 = lVar5 + 1) {
    lVar8 = *(long *)(pDVar4 + 0x28);
    pOVar2 = FieldDescriptor::real_containing_oneof((FieldDescriptor *)(lVar8 + lVar6));
    if (pOVar2 == (OneofDescriptor *)0x0) {
      pFVar3 = CreateFieldGeneratorInternal(local_d0,(FieldDescriptor *)(lVar8 + lVar6));
      (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[2])(pFVar3,local_c8);
      (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar3);
    }
    lVar6 = lVar6 + 0x48;
  }
  lVar5 = 0;
  pPVar7 = local_c8;
  while( true ) {
    if (*(int *)(pDVar4 + 0x6c) <= lVar5) break;
    lVar6 = *(long *)(pDVar4 + 0x30);
    UnderscoresToCamelCase((string *)&local_90,*(string **)(lVar6 + 8 + lVar5 * 0x28),false);
    std::__cxx11::string::string((string *)&local_c0,"name",&local_d1);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_c0);
    lVar6 = lVar6 + lVar5 * 0x28;
    std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_90);
    UnderscoresToCamelCase((string *)&local_90,*(string **)(lVar6 + 8),true);
    std::__cxx11::string::string((string *)&local_c0,"property_name",&local_d1);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_c0);
    local_a0 = lVar5;
    std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_90);
    pPVar7 = local_c8;
    io::Printer::Print(local_c8,&vars,"switch (other.$property_name$Case) {\n");
    io::Printer::Indent(pPVar7);
    lVar5 = 0;
    local_98 = lVar6;
    for (lVar8 = 0; lVar8 < *(int *)(local_98 + 4); lVar8 = lVar8 + 1) {
      descriptor_00 = (FieldDescriptor *)(*(long *)(local_98 + 0x20) + lVar5);
      pFVar3 = CreateFieldGeneratorInternal(local_d0,descriptor_00);
      GetPropertyName_abi_cxx11_((string *)&local_90,(csharp *)descriptor_00,descriptor);
      std::__cxx11::string::string((string *)&local_c0,"field_property_name",&local_d1);
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_c0);
      std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_90);
      pPVar7 = local_c8;
      io::Printer::Print(local_c8,&vars,"case $property_name$OneofCase.$field_property_name$:\n");
      io::Printer::Indent(pPVar7);
      (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[2])(pFVar3,pPVar7);
      io::Printer::Print<>(pPVar7,"break;\n");
      io::Printer::Outdent(pPVar7);
      (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar3);
      lVar5 = lVar5 + 0x48;
    }
    io::Printer::Outdent(pPVar7);
    io::Printer::Print<>(pPVar7,"}\n\n");
    lVar5 = local_a0 + 1;
    pDVar4 = local_d0->descriptor_;
  }
  io::Printer::Print<>(pPVar7,"_unknownFields = pb::UnknownFieldSet.Clone(other._unknownFields);\n")
  ;
  if (local_d0->has_extension_ranges_ == true) {
    io::Printer::Print<>(pPVar7,"_extensions = pb::ExtensionSet.Clone(other._extensions);\n");
  }
  io::Printer::Outdent(pPVar7);
  io::Printer::Print<>(pPVar7,"}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&local_d0->super_SourceGeneratorBase,pPVar7);
  io::Printer::Print(pPVar7,&vars,
                     "public $class_name$ Clone() {\n  return new $class_name$(this);\n}\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateCloningCode(io::Printer* printer) {
  std::map<std::string, std::string> vars;
  WriteGeneratedCodeAttributes(printer);
  vars["class_name"] = class_name();
    printer->Print(
    vars,
    "public $class_name$($class_name$ other) : this() {\n");
  printer->Indent();
  for (int i = 0; i < has_bit_field_count_; i++) {
    printer->Print("_hasBits$i$ = other._hasBits$i$;\n", "i", StrCat(i));
  }
  // Clone non-oneof fields first (treating optional proto3 fields as non-oneof)
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->real_containing_oneof()) {
      continue;
    }
    std::unique_ptr<FieldGeneratorBase> generator(CreateFieldGeneratorInternal(field));
    generator->GenerateCloningCode(printer);
  }
  // Clone just the right field for each real oneof
  for (int i = 0; i < descriptor_->real_oneof_decl_count(); ++i) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    vars["name"] = UnderscoresToCamelCase(oneof->name(), false);
    vars["property_name"] = UnderscoresToCamelCase(oneof->name(), true);
    printer->Print(vars, "switch (other.$property_name$Case) {\n");
    printer->Indent();
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      std::unique_ptr<FieldGeneratorBase> generator(CreateFieldGeneratorInternal(field));
      vars["field_property_name"] = GetPropertyName(field);
      printer->Print(
          vars,
          "case $property_name$OneofCase.$field_property_name$:\n");
      printer->Indent();
      generator->GenerateCloningCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Outdent();
    printer->Print("}\n\n");
  }
  // Clone unknown fields
  printer->Print(
      "_unknownFields = pb::UnknownFieldSet.Clone(other._unknownFields);\n");
  if (has_extension_ranges_) {
    printer->Print(
        "_extensions = pb::ExtensionSet.Clone(other._extensions);\n");
  }

  printer->Outdent();
  printer->Print("}\n\n");

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "public $class_name$ Clone() {\n"
    "  return new $class_name$(this);\n"
    "}\n\n");
}